

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O2

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableNoCopy
          (ArenaStringPtr *this,string *default_value,Arena *arena)

{
  string *psVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  
  if ((string *)(this->tagged_ptr_).ptr_ != default_value) {
    psVar1 = UnsafeMutablePointer_abi_cxx11_(this);
    return psVar1;
  }
  pbVar2 = Arena::Create<std::__cxx11::string>(arena);
  (this->tagged_ptr_).ptr_ = pbVar2;
  return pbVar2;
}

Assistant:

std::string* ArenaStringPtr::MutableNoCopy(const std::string* default_value,
                                           ::google::protobuf::Arena* arena) {
  if (!IsDonatedString() && !IsDefault(default_value)) {
    return UnsafeMutablePointer();
  } else {
    GOOGLE_DCHECK(IsDefault(default_value));
    // Allocate empty. The contents are not relevant.
    std::string* new_string = Arena::Create<std::string>(arena);
    tagged_ptr_.Set(new_string);
    return new_string;
  }
}